

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O0

TCHAR * MakeCdnList(CASC_CSV *Csv,size_t *Indices)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  ulong local_1f8;
  size_t i;
  size_t nHostsCount;
  size_t cbToAllocate;
  size_t nPathLength;
  size_t nHostsLength;
  size_t nCombinedLength;
  char szHostPath [128];
  char szHostsList [256];
  char *local_40;
  char *szHostPtr;
  TCHAR *szCdnEnd;
  TCHAR *szCdnPtr;
  TCHAR *szCdnList;
  size_t *Indices_local;
  CASC_CSV *Csv_local;
  
  szCdnPtr = (TCHAR *)0x0;
  memset(szHostPath + 0x78,0,0x100);
  memset(&nCombinedLength,0,0x80);
  iVar1 = CASC_CSV::GetString(Csv,szHostPath + 0x78,0xff,*Indices);
  if (iVar1 == 0) {
    iVar1 = CASC_CSV::GetString(Csv,(char *)&nCombinedLength,0x80,Indices[1]);
    if (iVar1 == 0) {
      if (szHostPath[0x78] != '\0') {
        sVar2 = strlen(szHostPath + 0x78);
        sVar3 = strlen((char *)&nCombinedLength);
        i = 1;
        for (local_1f8 = 0; local_1f8 < sVar2 + 1; local_1f8 = local_1f8 + 1) {
          if (szHostPath[local_1f8 + 0x78] == ' ') {
            szHostPath[local_1f8 + 0x78] = '\0';
            i = i + 1;
          }
        }
        lVar4 = sVar2 + 1 + (sVar3 + 1) * i;
        szCdnPtr = (TCHAR *)malloc(lVar4 + 1);
        if (szCdnPtr != (TCHAR *)0x0) {
          local_40 = szHostPath + 0x78;
          szCdnEnd = szCdnPtr;
          while ((*local_40 != '\0' &&
                 (sVar5 = CombineUrlPath(szCdnEnd,(size_t)(szCdnPtr + (lVar4 - (long)szCdnEnd)),
                                         local_40,(char *)&nCombinedLength), sVar5 != 0))) {
            szCdnEnd = szCdnEnd + sVar5 + 1;
            *szCdnEnd = '\0';
            sVar2 = strlen(local_40);
            local_40 = local_40 + sVar2 + 1;
          }
        }
      }
      Csv_local = (CASC_CSV *)szCdnPtr;
    }
    else {
      Csv_local = (CASC_CSV *)0x0;
    }
  }
  else {
    Csv_local = (CASC_CSV *)0x0;
  }
  return (TCHAR *)Csv_local;
}

Assistant:

static TCHAR * MakeCdnList(CASC_CSV & Csv, size_t * Indices)
{
    TCHAR * szCdnList = NULL;
    TCHAR * szCdnPtr;
    TCHAR * szCdnEnd;
    const char * szHostPtr;
    char szHostsList[0x100] = { 0 };
    char szHostPath[0x80] = { 0 };

    // Retrieve both strings
    if (Csv.GetString(szHostsList, sizeof(szHostsList) - 1, Indices[0]) != ERROR_SUCCESS)
        return NULL;
    if (Csv.GetString(szHostPath, sizeof(szHostPath), Indices[1]) != ERROR_SUCCESS)
        return NULL;
    
    // Did we retrieve something?
    if (szHostsList[0] != 0)
    {
        size_t nCombinedLength;
        size_t nHostsLength = strlen(szHostsList) + 1;
        size_t nPathLength = strlen(szHostPath);
        size_t cbToAllocate;
        size_t nHostsCount = 1;

        // Cut the hosts list to pieces
        for (size_t i = 0; i < nHostsLength; i++)
        {
            if (szHostsList[i] == ' ')
            {
                szHostsList[i] = 0;
                nHostsCount++;
            }
        }

        // Merge the hosts list
        cbToAllocate = nHostsLength + (nPathLength + 1) * nHostsCount + 1;
        szCdnList = szCdnPtr = CASC_ALLOC(TCHAR, cbToAllocate);
        szCdnEnd = szCdnList + cbToAllocate - 1;
        if (szCdnList != NULL)
        {
            for (szHostPtr = szHostsList; szHostPtr[0] != 0; szHostPtr += strlen(szHostPtr) + 1)
            {
                nCombinedLength = CombineUrlPath(szCdnPtr, (szCdnEnd - szCdnPtr), szHostPtr, szHostPath);
                if (nCombinedLength == 0)
                    break;

                szCdnPtr += nCombinedLength + 1;
                szCdnPtr[0] = 0;
            }
        }
    }

    return szCdnList;
}